

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  Serializer serializer;
  Sample_t<kiste::terminal_t,_Data,_Serializer> sample;
  _data_t local_31;
  _serializer_t local_30;
  Sample_t<kiste::terminal_t,_Data,_Serializer> local_20;
  
  local_20._serialize = &local_30;
  local_30.super_raw._os = (ostream *)&std::cout;
  local_30.caughtInt = false;
  local_30.caughtString = false;
  local_30.caughtException = false;
  local_20.child = (terminal_t *)&kiste::terminal;
  local_20.data = &local_31;
  test::Sample_t<kiste::terminal_t,_Data,_Serializer>::render(&local_20);
  if (((local_30.caughtInt != true) || (local_30.caughtString != true)) ||
     (iVar1 = 0, local_30.caughtException == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Missed some expected exception! Please inspect",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = Serializer{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
  if (not(serializer.caughtInt and serializer.caughtString and serializer.caughtException))
  {
    std::cerr << "Missed some expected exception! Please inspect" << std::endl;
    return 1;
  }
}